

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O0

void __thiscall
beagle::cpu::EigenDecompositionCube<float,_1>::updateTransitionMatrices
          (EigenDecompositionCube<float,_1> *this,int eigenIndex,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double *categoryRates,float **transitionMatrices,int count)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  undefined1 auVar6 [16];
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar7;
  long in_stack_00000008;
  long in_stack_00000010;
  int k_2;
  float sumD2;
  float sumD1_1;
  float sum_2;
  int j_2;
  int i_5;
  int m_1;
  float scaledEigenValue_1;
  int i_4;
  int l_2;
  int n_2;
  float *secondDerivMat;
  float *firstDerivMat_1;
  float *transitionMat_2;
  int u_2;
  int k_1;
  float sumD1;
  float sum_1;
  int j_1;
  int i_3;
  int m;
  float scaledEigenValue;
  int i_2;
  int l_1;
  int n_1;
  float *firstDerivMat;
  float *transitionMat_1;
  int u_1;
  int k;
  float sum;
  int j;
  int i_1;
  float *tmpCMatrices;
  int i;
  int l;
  int n;
  float *transitionMat;
  int u;
  int stateCountModFour;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined8 local_58;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_38;
  
  iVar1 = *(int *)(in_RDI + 0x10);
  if ((in_RCX == 0) && (in_R8 == 0)) {
    for (local_38 = 0; local_38 < (int)sumD2; local_38 = local_38 + 1) {
      lVar2 = *(long *)(in_stack_00000010 + (long)*(int *)(in_RDX + (long)local_38 * 4) * 8);
      local_44 = 0;
      for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x18); local_48 = local_48 + 1) {
        for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x10); local_4c = local_4c + 1) {
          dVar7 = exp((double)*(float *)(*(long *)(*(long *)(in_RDI + 8) + (long)in_ESI * 8) +
                                        (long)local_4c * 4) *
                      (double)(float)*(double *)(in_R9 + (long)local_38 * 8) *
                      *(double *)(in_stack_00000008 + (long)local_48 * 8));
          *(float *)(*(long *)(in_RDI + 0x28) + (long)local_4c * 4) = (float)dVar7;
        }
        local_58 = *(long *)(*(long *)(in_RDI + 0x40) + (long)in_ESI * 8);
        for (local_5c = 0; local_5c < *(int *)(in_RDI + 0x10); local_5c = local_5c + 1) {
          for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x10); local_60 = local_60 + 1) {
            local_64 = 0.0;
            for (local_68 = 0; local_68 < iVar1 / 4 << 2; local_68 = local_68 + 4) {
              auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0x28) +
                                                        (long)local_68 * 4)),
                                       ZEXT416(*(uint *)(local_58 + (long)local_68 * 4)),
                                       ZEXT416((uint)local_64));
              auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0x28) +
                                                        (long)(local_68 + 1) * 4)),
                                       ZEXT416(*(uint *)(local_58 + (long)(local_68 + 1) * 4)),
                                       ZEXT416(auVar6._0_4_));
              auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0x28) +
                                                        (long)(local_68 + 2) * 4)),
                                       ZEXT416(*(uint *)(local_58 + (long)(local_68 + 2) * 4)),
                                       ZEXT416(auVar6._0_4_));
              auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0x28) +
                                                        (long)(local_68 + 3) * 4)),
                                       ZEXT416(*(uint *)(local_58 + (long)(local_68 + 3) * 4)),
                                       ZEXT416(auVar6._0_4_));
              local_64 = auVar6._0_4_;
            }
            for (; local_68 < *(int *)(in_RDI + 0x10); local_68 = local_68 + 1) {
              auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0x28) +
                                                        (long)local_68 * 4)),
                                       ZEXT416(*(uint *)(local_58 + (long)local_68 * 4)),
                                       ZEXT416((uint)local_64));
              local_64 = auVar6._0_4_;
            }
            local_58 = local_58 + (long)*(int *)(in_RDI + 0x10) * 4;
            if (local_64 <= 0.0) {
              *(undefined4 *)(lVar2 + (long)local_44 * 4) = 0;
            }
            else {
              *(float *)(lVar2 + (long)local_44 * 4) = local_64;
            }
            local_44 = local_44 + 1;
          }
          *(undefined4 *)(lVar2 + (long)local_44 * 4) = 0x3f800000;
          local_44 = local_44 + 1;
        }
      }
    }
  }
  else if (in_R8 == 0) {
    for (local_6c = 0; local_6c < (int)sumD2; local_6c = local_6c + 1) {
      lVar2 = *(long *)(in_stack_00000010 + (long)*(int *)(in_RDX + (long)local_6c * 4) * 8);
      lVar3 = *(long *)(in_stack_00000010 + (long)*(int *)(in_RCX + (long)local_6c * 4) * 8);
      local_84 = 0;
      for (local_88 = 0; local_88 < *(int *)(in_RDI + 0x18); local_88 = local_88 + 1) {
        for (local_8c = 0; local_8c < *(int *)(in_RDI + 0x10); local_8c = local_8c + 1) {
          fVar5 = *(float *)(*(long *)(*(long *)(in_RDI + 8) + (long)in_ESI * 8) +
                            (long)local_8c * 4) *
                  (float)*(double *)(in_stack_00000008 + (long)local_88 * 8);
          dVar7 = exp((double)(fVar5 * (float)*(double *)(in_R9 + (long)local_6c * 8)));
          *(float *)(*(long *)(in_RDI + 0x28) + (long)local_8c * 4) = (float)dVar7;
          *(float *)(*(long *)(in_RDI + 0x30) + (long)local_8c * 4) =
               fVar5 * *(float *)(*(long *)(in_RDI + 0x28) + (long)local_8c * 4);
        }
        local_94 = 0;
        for (local_98 = 0; local_98 < *(int *)(in_RDI + 0x10); local_98 = local_98 + 1) {
          for (local_9c = 0; local_9c < *(int *)(in_RDI + 0x10); local_9c = local_9c + 1) {
            local_a0 = 0.0;
            local_a4 = 0;
            for (local_a8 = 0; local_a8 < *(int *)(in_RDI + 0x10); local_a8 = local_a8 + 1) {
              auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0x28) +
                                                        (long)local_a8 * 4)),
                                       ZEXT416(*(uint *)(*(long *)(*(long *)(in_RDI + 0x40) +
                                                                  (long)in_ESI * 8) +
                                                        (long)local_94 * 4)),ZEXT416((uint)local_a0)
                                      );
              local_a0 = auVar6._0_4_;
              auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0x30) +
                                                        (long)local_a8 * 4)),
                                       ZEXT416(*(uint *)(*(long *)(*(long *)(in_RDI + 0x40) +
                                                                  (long)in_ESI * 8) +
                                                        (long)local_94 * 4)),ZEXT416(local_a4));
              local_a4 = auVar6._0_4_;
              local_94 = local_94 + 1;
            }
            if (local_a0 <= 0.0) {
              *(undefined4 *)(lVar2 + (long)local_84 * 4) = 0;
            }
            else {
              *(float *)(lVar2 + (long)local_84 * 4) = local_a0;
            }
            *(uint *)(lVar3 + (long)local_84 * 4) = local_a4;
            local_84 = local_84 + 1;
          }
          *(undefined4 *)(lVar2 + (long)local_84 * 4) = 0x3f800000;
          *(undefined4 *)(lVar3 + (long)local_84 * 4) = 0;
          local_84 = local_84 + 1;
        }
      }
    }
  }
  else {
    for (local_ac = 0; local_ac < (int)sumD2; local_ac = local_ac + 1) {
      lVar2 = *(long *)(in_stack_00000010 + (long)*(int *)(in_RDX + (long)local_ac * 4) * 8);
      lVar3 = *(long *)(in_stack_00000010 + (long)*(int *)(in_RCX + (long)local_ac * 4) * 8);
      lVar4 = *(long *)(in_stack_00000010 + (long)*(int *)(in_R8 + (long)local_ac * 4) * 8);
      local_cc = 0;
      for (local_d0 = 0; local_d0 < *(int *)(in_RDI + 0x18); local_d0 = local_d0 + 1) {
        for (local_d4 = 0; local_d4 < *(int *)(in_RDI + 0x10); local_d4 = local_d4 + 1) {
          fVar5 = *(float *)(*(long *)(*(long *)(in_RDI + 8) + (long)in_ESI * 8) +
                            (long)local_d4 * 4) *
                  (float)*(double *)(in_stack_00000008 + (long)local_d0 * 8);
          dVar7 = exp((double)(fVar5 * (float)*(double *)(in_R9 + (long)local_ac * 8)));
          *(float *)(*(long *)(in_RDI + 0x28) + (long)local_d4 * 4) = (float)dVar7;
          *(float *)(*(long *)(in_RDI + 0x30) + (long)local_d4 * 4) =
               fVar5 * *(float *)(*(long *)(in_RDI + 0x28) + (long)local_d4 * 4);
          *(float *)(*(long *)(in_RDI + 0x38) + (long)local_d4 * 4) =
               fVar5 * *(float *)(*(long *)(in_RDI + 0x30) + (long)local_d4 * 4);
        }
        local_dc = 0;
        for (local_e0 = 0; local_e0 < *(int *)(in_RDI + 0x10); local_e0 = local_e0 + 1) {
          for (local_e4 = 0; local_e4 < *(int *)(in_RDI + 0x10); local_e4 = local_e4 + 1) {
            local_e8 = 0.0;
            local_ec = 0;
            local_f0 = 0;
            for (local_f4 = 0; local_f4 < *(int *)(in_RDI + 0x10); local_f4 = local_f4 + 1) {
              auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0x28) +
                                                        (long)local_f4 * 4)),
                                       ZEXT416(*(uint *)(*(long *)(*(long *)(in_RDI + 0x40) +
                                                                  (long)in_ESI * 8) +
                                                        (long)local_dc * 4)),ZEXT416((uint)local_e8)
                                      );
              local_e8 = auVar6._0_4_;
              auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0x30) +
                                                        (long)local_f4 * 4)),
                                       ZEXT416(*(uint *)(*(long *)(*(long *)(in_RDI + 0x40) +
                                                                  (long)in_ESI * 8) +
                                                        (long)local_dc * 4)),ZEXT416(local_ec));
              local_ec = auVar6._0_4_;
              auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0x38) +
                                                        (long)local_f4 * 4)),
                                       ZEXT416(*(uint *)(*(long *)(*(long *)(in_RDI + 0x40) +
                                                                  (long)in_ESI * 8) +
                                                        (long)local_dc * 4)),ZEXT416(local_f0));
              local_f0 = auVar6._0_4_;
              local_dc = local_dc + 1;
            }
            if (local_e8 <= 0.0) {
              *(undefined4 *)(lVar2 + (long)local_cc * 4) = 0;
            }
            else {
              *(float *)(lVar2 + (long)local_cc * 4) = local_e8;
            }
            *(uint *)(lVar3 + (long)local_cc * 4) = local_ec;
            *(uint *)(lVar4 + (long)local_cc * 4) = local_f0;
            local_cc = local_cc + 1;
          }
          *(undefined4 *)(lVar2 + (long)local_cc * 4) = 0x3f800000;
          *(undefined4 *)(lVar3 + (long)local_cc * 4) = 0;
          *(undefined4 *)(lVar4 + (long)local_cc * 4) = 0;
          local_cc = local_cc + 1;
        }
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatrices(int eigenIndex,
                                                      const int* probabilityIndices,
                                                      const int* firstDerivativeIndices,
                                                      const int* secondDerivativeIndices,
                                                      const double* edgeLengths,
                                                      const double* categoryRates,
                                                      REALTYPE** transitionMatrices,
                                                      int count) {
#ifdef UNROLL
	int stateCountModFour = (kStateCount / 4) * 4;
#endif
//	if (probabilityIndices == NULL) {  // used to store derivative matrices for derivatives through pre-order traversals
//
//	    if (secondDerivativeIndices == NULL) {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        firstDerivTmp[i] = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    } else {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                        firstDerivTmp[i] = scaledEigenValue;
//                        secondDerivTmp[i] = scaledEigenValue * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            REALTYPE sumD2 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            secondDerivMat[n] = sumD2;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            secondDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    }
//
//	} else {

        if (firstDerivativeIndices == NULL &&secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        matrixTmp[i] = exp(gEigenValues[eigenIndex][i] * ((REALTYPE)edgeLengths[u] * categoryRates[l]));
                    }

                    REALTYPE* tmpCMatrices = gCMatrices[eigenIndex];
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
#ifdef UNROLL
                            int k = 0;
                            for (; k < stateCountModFour; k += 4) {
                                sum += tmpCMatrices[k + 0] * matrixTmp[k + 0];
                                sum += tmpCMatrices[k + 1] * matrixTmp[k + 1];
                                sum += tmpCMatrices[k + 2] * matrixTmp[k + 2];
                                sum += tmpCMatrices[k + 3] * matrixTmp[k + 3];
                            }
                            for (; k < kStateCount; k++) {
                                sum += tmpCMatrices[k] * matrixTmp[k];
                            }
                            tmpCMatrices += kStateCount;
#else
                            for (int k = 0; k < kStateCount; k++) {
							sum += *tmpCMatrices++ * matrixTmp[k];
						}
#endif
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            n += T_PAD;
                        }
                    }
                }

                if (DEBUGGING_OUTPUT) {
                    int kMatrixSize = kStateCount * kStateCount;
                    fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
                    for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                        fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
                }
            }


        } else if (secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k]; ///gCMatrices[eigenIndex] =  eigenVectors \otimes InveigenVectors
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        } else {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                        secondDerivTmp[i] = scaledEigenValue * firstDerivTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            REALTYPE sumD2 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k];
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            secondDerivMat[n] = sumD2;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            secondDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        }
//    }
}